

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  bool bVar1;
  pointer pIVar2;
  reference this_00;
  pointer this_01;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
  *__range2;
  bool run_on_debug_line_insts_local;
  function<void_(spvtools::opt::Instruction_*)> *f_local;
  Module *this_local;
  
  InstructionList::ForEachInst(&this->capabilities_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->extensions_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->ext_inst_imports_,f,run_on_debug_line_insts);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->memory_model_);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&this->memory_model_);
    opt::Instruction::ForEachInst(pIVar2,f,run_on_debug_line_insts);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->sampled_image_address_mode_);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&this->sampled_image_address_mode_);
    opt::Instruction::ForEachInst(pIVar2,f,run_on_debug_line_insts);
  }
  InstructionList::ForEachInst(&this->entry_points_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->execution_modes_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs1_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs2_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->debugs3_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->ext_inst_debuginfo_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->annotations_,f,run_on_debug_line_insts);
  InstructionList::ForEachInst(&this->types_values_,f,run_on_debug_line_insts);
  __end2 = std::
           vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ::begin(&this->functions_);
  i = (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *)
      std::
      vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
      ::end(&this->functions_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
                                     *)&i), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
              ::operator*(&__end2);
    this_01 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->(this_00);
    opt::Function::ForEachInst(this_01,f,run_on_debug_line_insts,true);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_*,_std::vector<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(Instruction*)>& f,
                         bool run_on_debug_line_insts) {
#define DELEGATE(list) list.ForEachInst(f, run_on_debug_line_insts)
  DELEGATE(capabilities_);
  DELEGATE(extensions_);
  DELEGATE(ext_inst_imports_);
  if (memory_model_) memory_model_->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    sampled_image_address_mode_->ForEachInst(f, run_on_debug_line_insts);
  DELEGATE(entry_points_);
  DELEGATE(execution_modes_);
  DELEGATE(debugs1_);
  DELEGATE(debugs2_);
  DELEGATE(debugs3_);
  DELEGATE(ext_inst_debuginfo_);
  DELEGATE(annotations_);
  DELEGATE(types_values_);
  for (auto& i : functions_) {
    i->ForEachInst(f, run_on_debug_line_insts,
                   /* run_on_non_semantic_insts = */ true);
  }
#undef DELEGATE
}